

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O3

bool kat::CheckQPLT(char *line)

{
  int iVar1;
  float loss;
  float quantile;
  float periodWeight;
  int summaryID;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  int eventID;
  int period;
  
  iVar1 = __isoc99_sscanf(line,"%d,%f,%d,%d,%d,%d,%d,%d,%d,%f,%f",&period,&periodWeight,&eventID,
                          &year,&month,&day,&hour,&minute,&summaryID,&quantile,&loss);
  return iVar1 == 0xb;
}

Assistant:

bool CheckQPLT(char *line) {
		int period, eventID, year, month, day, hour, minute, summaryID;
		float periodWeight, quantile, loss;
		if (sscanf(line, "%d,%f,%d,%d,%d,%d,%d,%d,%d,%f,%f", &period,
			   &periodWeight, &eventID, &year, &month, &day, &hour,
			   &minute, &summaryID, &quantile, &loss) == number_of_fields::QPLT)
		{
			return true;
		} else return false;
	}